

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test::~iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test
          (iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test *this)

{
  iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test *this_local;
  
  ~iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Arithmetic)
{
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + 2 == 44), "expansion: 42 + 2 == 44");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() - 2 == 40), "expansion: 42 - 2 == 40");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() * 2 == 84), "expansion: 42 * 2 == 84");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() / 2 == 21), "expansion: 42 / 2 == 21");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() % 4 == 2), "expansion: 42 % 4 == 2");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + f() + f() == 126), "expansion: 42 + 42 + 42 == 126");
}